

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnAtomicWait
          (SharedValidator *this,Location *loc,Opcode opcode,Address alignment)

{
  Address alignment_00;
  Location *loc_00;
  Address natural_alignment;
  Result RVar1;
  Var local_70;
  Enum local_28;
  Address local_24;
  Location *pLStack_20;
  Address alignment_local;
  Location *loc_local;
  SharedValidator *this_local;
  Opcode opcode_local;
  Result result;
  
  local_24 = alignment;
  pLStack_20 = loc;
  loc_local = (Location *)this;
  this_local._0_4_ = opcode.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = pLStack_20;
  Var::Var(&local_70,0,pLStack_20);
  local_28 = (Enum)CheckMemoryIndex(this,&local_70,(MemoryType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_28);
  Var::~Var(&local_70);
  loc_00 = pLStack_20;
  alignment_00 = local_24;
  natural_alignment = Opcode::GetMemorySize((Opcode *)&this_local);
  RVar1 = CheckAtomicAlign(this,loc_00,alignment_00,natural_alignment);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = TypeChecker::OnAtomicWait(&this->typechecker_,this_local._0_4_);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnAtomicWait(const Location& loc,
                                     Opcode opcode,
                                     Address alignment) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnAtomicWait(opcode);
  return result;
}